

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandDetector.cpp
# Opt level: O2

HandDetector * __thiscall
HandDetector::detectHands_range(HandDetector *this,Mat *img,Scalar *lower,Scalar *upper)

{
  Mat aMStack_e8 [96];
  _OutputArray local_88;
  _InputArray local_70;
  _InputArray local_58;
  _InputArray local_40;
  
  std::vector<Hand,_std::allocator<Hand>_>::clear((vector<Hand,_std::allocator<Hand>_> *)img);
  cv::Mat::Mat((Mat *)this);
  local_40.sz.width = 0;
  local_40.sz.height = 0;
  local_40.flags = 0x1010000;
  local_58.flags = -0x3efdfffa;
  local_58.sz.width = 1;
  local_58.sz.height = 4;
  local_70.flags = -0x3efdfffa;
  local_88.super__InputArray.sz.width = 0;
  local_88.super__InputArray.sz.height = 0;
  local_70.sz.width = 1;
  local_70.sz.height = 4;
  local_88.super__InputArray.flags = 0x2010000;
  local_88.super__InputArray.obj = this;
  local_58.obj = upper;
  local_40.obj = lower;
  cv::inRange(&local_40,&local_58,&local_70,&local_88);
  cv::Mat::Mat(aMStack_e8,(Mat *)this);
  findHandsContours((HandDetector *)img,aMStack_e8);
  cv::Mat::~Mat(aMStack_e8);
  return this;
}

Assistant:

Mat HandDetector::detectHands_range(Mat img, Scalar lower, Scalar upper) {
    hands.clear();
    Mat mask;
    inRange(img, lower, upper, mask);
    findHandsContours(mask);
    return mask;
}